

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConverterRegistry.cpp
# Opt level: O0

ConverterFunction
SoapySDR::ConverterRegistry::getFunction(string *sourceFormat,string *targetFormat)

{
  size_type sVar1;
  runtime_error *this;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  pointer ppVar5;
  map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
  *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
  *in_stack_fffffffffffffea0;
  key_type *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  string local_108 [39];
  undefined1 local_e1;
  string local_a0 [35];
  undefined1 local_7d;
  string local_30 [48];
  
  sVar1 = std::map<$5159af05$>::count
                    ((map<_5159af05_> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (sVar1 == 0) {
    local_7d = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::runtime_error::runtime_error(this,local_30);
    local_7d = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::map<$5159af05$>::operator[]
            ((map<_5159af05_> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
          ::count(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (sVar2 == 0) {
    local_e1 = 1;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(pbVar3,(char *)in_stack_fffffffffffffe90);
    std::operator+(pbVar3,in_stack_fffffffffffffe90);
    std::runtime_error::runtime_error((runtime_error *)pbVar3,local_a0);
    local_e1 = 0;
    __cxa_throw(pbVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::map<$5159af05$>::operator[]
            ((map<_5159af05_> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
                *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  sVar4 = std::
          map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
          ::size((map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
                  *)0x179d35);
  if (sVar4 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffe98,(char *)pbVar3);
    std::operator+(in_stack_fffffffffffffe98,pbVar3);
    std::runtime_error::runtime_error((runtime_error *)pbVar3,local_108);
    __cxa_throw(pbVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::map<$5159af05$>::operator[]
            ((map<_5159af05_> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>_>_>_>
                *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::
  map<SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double),_std::less<SoapySDR::ConverterRegistry::FunctionPriority>,_std::allocator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
  ::rbegin(in_stack_fffffffffffffe88);
  ppVar5 = std::
           reverse_iterator<std::_Rb_tree_iterator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
           ::operator->((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_SoapySDR::ConverterRegistry::FunctionPriority,_void_(*)(const_void_*,_void_*,_unsigned_long,_double)>_>_>
                         *)in_stack_fffffffffffffe90);
  return (ConverterFunction)ppVar5->second;
}

Assistant:

SoapySDR::ConverterRegistry::ConverterFunction SoapySDR::ConverterRegistry::getFunction(const std::string &sourceFormat, const std::string &targetFormat)
{
  if (formatConverters.count(sourceFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion source not registered; "
			       "sourceFormat="+sourceFormat+", targetFormat="+targetFormat);
    }
  
  if (formatConverters[sourceFormat].count(targetFormat) == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() conversion target not registered; "
			       "sourceFormat="+sourceFormat+", targetFormat="+targetFormat);
    }

  if (formatConverters[sourceFormat][targetFormat].size() == 0)
    {
      throw std::runtime_error("ConverterRegistry::getFunction() no functions found for registered conversion; "
			       "sourceFormat="+sourceFormat+", targetFormat="+targetFormat);
    }

  return formatConverters[sourceFormat][targetFormat].rbegin()->second;
}